

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O2

void Imf_3_4::hufUncompress(char *compressed,int nCompressed,unsigned_short *raw,int nRaw)

{
  unsigned_short *puVar1;
  char *pcVar2;
  byte bVar3;
  unsigned_short uVar4;
  uint maxSymbol;
  uint uVar5;
  AutoArray<unsigned_long,_65537> AVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  HufDec *hdecod;
  uint64_t uVar10;
  int *piVar11;
  int *piVar12;
  InputExc *pIVar13;
  sbyte sVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar19;
  HufDec *pHVar20;
  long lVar21;
  unsigned_short *puVar22;
  byte *pbVar23;
  uchar *b;
  byte *pbVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  AutoArray<unsigned_long,_65537> freq;
  int local_5444;
  long local_5440;
  long local_5438;
  ulong local_5430;
  long local_5428;
  AutoArray<Imf_3_4::(anonymous_namespace)::HufDec,_16384> hdec;
  char *ptr;
  uint64_t c;
  char *local_5408;
  FastHufDecoder fhd;
  uint uVar18;
  
  if (nCompressed < 0x14) {
    if (nRaw == 0) {
      return;
    }
  }
  else {
    local_5440 = CONCAT44(local_5440._4_4_,nRaw);
    local_5430 = (ulong)*(uint *)compressed;
    if (0x10000 < local_5430) goto LAB_0017da39;
    maxSymbol = *(uint *)(compressed + 4);
    if (0x10000 < maxSymbol) goto LAB_0017da39;
    iVar25 = *(int *)(compressed + 0xc);
    lVar27 = (long)iVar25;
    pcVar2 = compressed + 0x14;
    uVar26 = lVar27 + 7U >> 3;
    local_5408 = compressed + (long)(ulong)(uint)nCompressed;
    ptr = pcVar2;
    if (compressed + uVar26 + 0x14 <= local_5408) {
      bVar7 = FastHufDecoder::enabled();
      local_5438 = lVar27;
      if (0x80 < iVar25 && bVar7) {
        FastHufDecoder::FastHufDecoder
                  (&fhd,&ptr,nCompressed + -0x14,(int)local_5430,maxSymbol,maxSymbol);
        if (ptr + (uVar26 - (long)compressed) <= (char *)(ulong)(uint)nCompressed) {
          FastHufDecoder::decode(&fhd,(uchar *)ptr,(int)local_5438,raw,(int)local_5440);
          FastHufDecoder::~FastHufDecoder(&fhd);
          return;
        }
        anon_unknown_0::notEnoughData();
LAB_0017da6e:
        pIVar13 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc
                  (pIVar13,"Error in header for Huffman-encoded data (invalid number of bits).");
        __cxa_throw(pIVar13,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      AutoArray<unsigned_long,_65537>::AutoArray(&freq);
      hdecod = (HufDec *)operator_new__(0x40000);
      hdec._data = hdecod;
      memset(hdecod,0,0x40000);
      AVar6 = freq;
      memset(freq._data,0,0x80008);
      uVar26 = local_5430;
      c = 0;
      local_5444 = 0;
      local_5428 = CONCAT44(local_5428._4_4_,maxSymbol + 1);
      uVar16 = local_5430 & 0xffffffff;
      fhd._0_8_ = pcVar2;
      while (pbVar24 = (byte *)fhd._0_8_, iVar25 = (int)uVar16, iVar25 <= (int)maxSymbol) {
        if ((long)(ulong)(nCompressed - 0x14) < fhd._0_8_ - (long)pcVar2) goto LAB_0017da25;
        uVar10 = anon_unknown_0::getBits(6,&c,&local_5444,(char **)&fhd);
        AVar6._data[iVar25] = uVar10;
        if (uVar10 == 0x3f) {
          if ((long)(ulong)(nCompressed - 0x14) < fhd._0_8_ - (long)pcVar2) goto LAB_0017da25;
          uVar10 = anon_unknown_0::getBits(8,&c,&local_5444,(char **)&fhd);
          if ((int)local_5428 < (int)uVar10 + iVar25 + 6) goto LAB_0017da2f;
          for (lVar27 = 0; (int)uVar10 + 6 != (int)lVar27; lVar27 = lVar27 + 1) {
            AVar6._data[iVar25 + lVar27] = 0;
          }
LAB_0017d559:
          iVar25 = iVar25 + (int)lVar27 + -1;
        }
        else {
          uVar9 = (uint)uVar10;
          if (0x3a < uVar9) {
            if ((int)(uVar9 + iVar25 + -0x39) <= (int)local_5428) {
              for (lVar27 = 0; uVar9 - 0x39 != (int)lVar27; lVar27 = lVar27 + 1) {
                AVar6._data[iVar25 + lVar27] = 0;
              }
              goto LAB_0017d559;
            }
            goto LAB_0017da2f;
          }
        }
        uVar16 = (ulong)(iVar25 + 1);
      }
      ptr = (char *)fhd._0_8_;
      anon_unknown_0::hufCanonicalCodeTable(AVar6._data);
      AVar6 = freq;
      if (((long)local_5408 - (long)pbVar24) * 8 < local_5438) goto LAB_0017da6e;
      for (; uVar26 <= maxSymbol; uVar26 = uVar26 + 1) {
        uVar16 = AVar6._data[uVar26];
        uVar19 = uVar16 >> 6;
        uVar9 = (uint)uVar16 & 0x3f;
        sVar14 = (sbyte)uVar9;
        if (uVar19 >> sVar14 != 0) goto LAB_0017da20;
        if (uVar9 < 0xf) {
          if ((uVar16 & 0x3f) != 0) {
            lVar21 = uVar19 << (0xeU - sVar14 & 0x3f);
            for (lVar27 = 0; (ulong)(uint)(1 << (0xeU - sVar14 & 0x1f)) << 4 != lVar27;
                lVar27 = lVar27 + 0x10) {
              if (((&hdecod[lVar21].field_0x0)[lVar27] != '\0') ||
                 (*(long *)((long)&hdecod[lVar21].p + lVar27) != 0)) goto LAB_0017da20;
              *(uint *)(&hdecod[lVar21].field_0x0 + lVar27) = (int)uVar26 << 8 | uVar9;
            }
          }
        }
        else {
          uVar19 = uVar19 >> (sVar14 - 0xeU & 0x3f);
          if ((char)*(int *)(hdecod + uVar19) != '\0') goto LAB_0017da20;
          pHVar20 = hdecod + uVar19;
          iVar25 = *(int *)(hdecod + uVar19) + 0x100;
          *(int *)pHVar20 = iVar25;
          piVar12 = pHVar20->p;
          if (piVar12 == (int *)0x0) {
            piVar12 = (int *)operator_new__(4);
            pHVar20->p = piVar12;
          }
          else {
            iVar25 = iVar25 >> 8;
            uVar16 = (long)iVar25 * 4;
            if (iVar25 < 0) {
              uVar16 = 0xffffffffffffffff;
            }
            piVar11 = (int *)operator_new__(uVar16);
            pHVar20->p = piVar11;
            if (iVar25 < 2) {
              iVar25 = 1;
            }
            for (uVar16 = 0; iVar25 - 1 != uVar16; uVar16 = uVar16 + 1) {
              piVar11[uVar16] = piVar12[uVar16];
            }
            operator_delete__(piVar12);
            piVar12 = pHVar20->p;
            iVar25 = *(int *)pHVar20;
          }
          piVar12[(long)(iVar25 >> 8) + -1] = (int)uVar26;
        }
      }
      local_5440 = (long)(int)local_5440;
      puVar1 = raw + local_5440;
      pbVar23 = (byte *)((long)(((int)local_5438 + 7) / 8) + (long)pbVar24);
      uVar9 = 0;
      uVar26 = 0;
      puVar22 = raw;
      while (pbVar24 < pbVar23) {
        bVar3 = *pbVar24;
        pbVar24 = pbVar24 + 1;
        uVar26 = uVar26 << 8 | (ulong)bVar3;
        uVar9 = uVar9 + 8;
        while (0xd < (int)uVar9) {
          uVar16 = (ulong)(((uint)(uVar26 >> ((char)uVar9 - 0xeU & 0x3f)) & 0x3fff) << 4);
          iVar25 = *(int *)(&hdecod->field_0x0 + uVar16);
          uVar15 = iVar25 >> 8;
          if (iVar25 << 0x18 == 0) {
            lVar27 = *(long *)((long)&hdecod->p + uVar16);
            if (lVar27 == 0) goto LAB_0017da16;
            local_5430 = 0;
            if (0 < (int)uVar15) {
              local_5430 = (ulong)uVar15;
            }
            uVar16 = 0;
LAB_0017d790:
            uVar19 = local_5430;
            if (uVar16 != local_5430) {
              uVar5 = *(uint *)(lVar27 + uVar16 * 4);
              local_5428 = (long)(int)uVar5;
              uVar18 = (uint)freq._data[local_5428];
              uVar17 = uVar18 & 0x3f;
              for (; ((int)uVar9 < (int)uVar17 && (pbVar24 < pbVar23)); pbVar24 = pbVar24 + 1) {
                uVar26 = uVar26 << 8 | (ulong)*pbVar24;
                uVar9 = uVar9 + 8;
              }
              if (((int)uVar9 < (int)uVar17) ||
                 (freq._data[local_5428] >> 6 !=
                  (~(-1L << (sbyte)uVar17) & uVar26 >> ((char)uVar9 - (sbyte)uVar17 & 0x3fU))))
              goto LAB_0017d820;
              uVar17 = uVar9 - (uVar18 & 0x3f);
              uVar19 = uVar16;
              if (uVar5 == maxSymbol) {
                if ((int)uVar17 < 8) {
                  bVar3 = *pbVar24;
                  pbVar24 = pbVar24 + 1;
                  uVar26 = uVar26 << 8 | (ulong)bVar3;
                  uVar17 = (uVar9 - (uVar18 & 0x3f)) + 8;
                }
                uVar16 = uVar26 >> ((byte)(uVar17 - 8) & 0x3f);
                if (puVar1 < puVar22 + (uVar16 & 0xff)) goto LAB_0017da1b;
                if (puVar22 + -1 < raw) goto LAB_0017da2a;
                uVar4 = puVar22[-1];
                while (cVar8 = (char)uVar16, uVar16 = (ulong)(byte)(cVar8 - 1), uVar9 = uVar17 - 8,
                      cVar8 != '\0') {
                  *puVar22 = uVar4;
                  puVar22 = puVar22 + 1;
                }
              }
              else {
                if (puVar1 <= puVar22) goto LAB_0017da1b;
                *puVar22 = (unsigned_short)uVar5;
                puVar22 = puVar22 + 1;
                uVar9 = uVar17;
              }
            }
            if ((uint)uVar19 == uVar15) goto LAB_0017da16;
          }
          else {
            uVar9 = uVar9 - ((iVar25 << 0x18) >> 0x18);
            if ((int)uVar9 < 0) goto LAB_0017da16;
            if (uVar15 == maxSymbol) {
              if (uVar9 < 8) {
                bVar3 = *pbVar24;
                pbVar24 = pbVar24 + 1;
                uVar26 = uVar26 << 8 | (ulong)bVar3;
                uVar9 = uVar9 | 8;
              }
              uVar9 = uVar9 - 8;
              uVar16 = uVar26 >> ((byte)uVar9 & 0x3f);
              if (puVar1 < puVar22 + (uVar16 & 0xff)) goto LAB_0017da1b;
              if (puVar22 + -1 < raw) goto LAB_0017da2a;
              uVar4 = puVar22[-1];
              while (cVar8 = (char)uVar16, uVar16 = (ulong)(byte)(cVar8 - 1), cVar8 != '\0') {
                *puVar22 = uVar4;
                puVar22 = puVar22 + 1;
              }
            }
            else {
              if (puVar1 <= puVar22) goto LAB_0017da1b;
              *puVar22 = (unsigned_short)((uint)iVar25 >> 8);
              puVar22 = puVar22 + 1;
            }
          }
        }
      }
      uVar15 = -(int)local_5438 & 7;
      uVar26 = uVar26 >> (sbyte)uVar15;
      uVar9 = uVar9 - uVar15;
      while( true ) {
        lVar27 = (long)puVar22 - (long)raw;
        while( true ) {
          if ((int)uVar9 < 1) {
            if (lVar27 >> 1 == local_5440) {
              anon_unknown_0::hufFreeDecTable(hdecod);
              AutoArray<Imf_3_4::(anonymous_namespace)::HufDec,_16384>::~AutoArray(&hdec);
              AutoArray<unsigned_long,_65537>::~AutoArray(&freq);
              return;
            }
            goto LAB_0017da2a;
          }
          iVar25 = *(int *)(&hdecod->field_0x0 +
                           (((uint)(uVar26 << (0xeU - (char)uVar9 & 0x3f)) & 0x3fff) << 4));
          if ((iVar25 << 0x18 == 0) || (uVar9 = uVar9 - ((iVar25 << 0x18) >> 0x18), (int)uVar9 < 0))
          goto LAB_0017da16;
          if (iVar25 >> 8 == maxSymbol) break;
          if (puVar1 <= puVar22) goto LAB_0017da1b;
          *puVar22 = (unsigned_short)((uint)iVar25 >> 8);
          puVar22 = puVar22 + 1;
          lVar27 = lVar27 + 2;
        }
        if (uVar9 < 8) {
          bVar3 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar26 = uVar26 << 8 | (ulong)bVar3;
          uVar9 = uVar9 | 8;
        }
        uVar9 = uVar9 - 8;
        uVar16 = uVar26 >> ((byte)uVar9 & 0x3f);
        if (puVar1 < puVar22 + (uVar16 & 0xff)) goto LAB_0017da1b;
        if (puVar22 + -1 < raw) break;
        uVar4 = puVar22[-1];
        while (cVar8 = (char)uVar16, uVar16 = (ulong)(byte)(cVar8 - 1), cVar8 != '\0') {
          *puVar22 = uVar4;
          puVar22 = puVar22 + 1;
        }
      }
      goto LAB_0017da2a;
    }
  }
  goto LAB_0017da34;
LAB_0017d820:
  uVar16 = uVar16 + 1;
  goto LAB_0017d790;
LAB_0017da16:
  anon_unknown_0::invalidCode();
LAB_0017da1b:
  anon_unknown_0::tooMuchData();
LAB_0017da20:
  anon_unknown_0::invalidTableEntry();
LAB_0017da25:
  anon_unknown_0::unexpectedEndOfTable();
LAB_0017da2a:
  anon_unknown_0::notEnoughData();
LAB_0017da2f:
  anon_unknown_0::tableTooLong();
LAB_0017da34:
  anon_unknown_0::notEnoughData();
LAB_0017da39:
  pIVar13 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(pIVar13,"Error in Huffman-encoded data (invalid code table size).");
  __cxa_throw(pIVar13,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

void
hufUncompress (
    const char compressed[], int nCompressed, unsigned short raw[], int nRaw)
{
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) notEnoughData ();

        return;
    }

    int im = readUInt (compressed);
    int iM = readUInt (compressed + 4);
    // int tableLength = readUInt (compressed + 8);
    int nBits = readUInt (compressed + 12);

    if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE)
        invalidTableSize ();

    const char* ptr = compressed + 20;

    uint64_t nBytes = (static_cast<uint64_t> (nBits) + 7) / 8;

    if (ptr + nBytes > compressed + nCompressed)
    {
        notEnoughData ();
        return;
    }

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //

    if (FastHufDecoder::enabled () && nBits > 128)
    {
        FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);

        // must be nBytes remaining in buffer
        if (ptr - compressed + nBytes > static_cast<uint64_t> (nCompressed))
        {
            notEnoughData ();
            return;
        }

        fhd.decode ((unsigned char*) ptr, nBits, raw, nRaw);
    }
    else
    {
        AutoArray<uint64_t, HUF_ENCSIZE> freq;
        AutoArray<HufDec, HUF_DECSIZE>   hdec;

        hufClearDecTable (hdec);

        hufUnpackEncTable (
            &ptr, nCompressed - (ptr - compressed), im, iM, freq);

        try
        {
            if (nBits > 8 * (nCompressed - (ptr - compressed))) invalidNBits ();

            hufBuildDecTable (freq, im, iM, hdec);
            hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);
        }
        catch (...)
        {
            hufFreeDecTable (hdec);
            throw;
        }

        hufFreeDecTable (hdec);
    }
}